

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckEqual<int,FIX::LeavesQty>
               (TestResults *results,int *expected,LeavesQty *actual,TestDetails *details)

{
  int iVar1;
  ostream *poVar2;
  char *failure;
  double dVar3;
  MemoryOutStream stream;
  undefined1 local_1c0 [408];
  
  iVar1 = *expected;
  dVar3 = FIX::DoubleField::getValue(&actual->super_QtyField);
  if ((dVar3 != (double)iVar1) || (NAN(dVar3) || NAN((double)iVar1))) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Expected ",9);
    poVar2 = (ostream *)std::ostream::operator<<(local_1c0,*expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," but was ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(actual->super_QtyField).super_FieldBase.m_string._M_dataplus._M_p,
               (actual->super_QtyField).super_FieldBase.m_string._M_string_length);
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x90));
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}